

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

Vec_Str_t *
Cec_ManSatSolveSeq(Vec_Ptr_t *vPatts,Gia_Man_t *pAig,Cec_ParSat_t *pPars,int nRegs,int *pnPats)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  Cec_ManSat_t *p;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Bar_Progress_t *p_00;
  Vec_Int_t *pVVar8;
  void **ppvVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  int nItemsTotal;
  long lVar16;
  size_t sVar17;
  timespec ts;
  int local_74;
  int local_60;
  timespec local_58;
  Cec_ParSat_t *local_48;
  int *local_40;
  Gia_Obj_t *local_38;
  
  iVar4 = clock_gettime(3,&local_58);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    local_60 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8) >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),0xc) >> 0x1f)) +
               (int)local_58.tv_sec * -1000000;
  }
  if (vPatts->nSize < 2) {
LAB_005b0631:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar4 = *(int *)(vPatts->pArray + 1);
  iVar11 = *(int *)vPatts->pArray;
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  p = Cec_ManSatCreate(pAig,pPars);
  nItemsTotal = pAig->vCos->nSize - pAig->nRegs;
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < nItemsTotal - 1U) {
    iVar5 = nItemsTotal;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)malloc((long)iVar5);
  }
  pVVar6->pArray = pcVar7;
  p_00 = Bar_ProgressStart(_stdout,nItemsTotal);
  pVVar8 = pAig->vCos;
  if (pVVar8->nSize < 1) {
    iVar4 = -1;
  }
  else {
    iVar11 = (iVar4 - iVar11 & 0x1ffffffcU) << 3;
    lVar14 = 0;
    iVar4 = 0;
    local_74 = iVar11;
    local_48 = pPars;
    local_40 = pnPats;
    do {
      iVar5 = pVVar8->pArray[lVar14];
      if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pAig->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if ((p_00 == (Bar_Progress_t *)0x0) || (p_00->nItemsNext <= lVar14)) {
        Bar_ProgressUpdate_int(p_00,(int)lVar14,"SAT...");
      }
      pGVar3 = pGVar3 + iVar5;
      uVar13 = (uint)*(undefined8 *)pGVar3;
      if ((~*(ulong *)(pGVar3 + -(ulong)(uVar13 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
        uVar1 = pVVar6->nSize;
        uVar2 = pVVar6->nCap;
        if ((uVar13 >> 0x1d & 1) == 0) {
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar2 * 2;
              if ((int)sVar17 <= (int)uVar2) goto LAB_005b04f9;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar17);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar17);
              }
            }
            pVVar6->pArray = pcVar7;
            pVVar6->nCap = (int)sVar17;
          }
LAB_005b04f9:
          pVVar6->nSize = uVar1 + 1;
          pVVar6->pArray[(int)uVar1] = '\x01';
        }
        else {
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar2 * 2;
              if ((int)sVar17 <= (int)uVar2) goto LAB_005b052c;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar17);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar17);
              }
            }
            pVVar6->pArray = pcVar7;
            pVVar6->nCap = (int)sVar17;
          }
LAB_005b052c:
          pVVar6->nSize = uVar1 + 1;
          pVVar6->pArray[(int)uVar1] = '\0';
        }
      }
      else {
        local_38 = pGVar3;
        iVar5 = Cec_ManSatCheckNode(p,(Gia_Obj_t *)
                                      ((ulong)(uVar13 >> 0x1d & 1) ^
                                      (ulong)(pGVar3 + -(ulong)(uVar13 & 0x1fffffff))));
        uVar13 = pVVar6->nSize;
        uVar1 = pVVar6->nCap;
        if (uVar13 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar6->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
            }
            sVar17 = 0x10;
          }
          else {
            sVar17 = (ulong)uVar1 * 2;
            if ((int)sVar17 <= (int)uVar1) goto LAB_005b0350;
            if (pVVar6->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar17);
            }
            else {
              pcVar7 = (char *)realloc(pVVar6->pArray,sVar17);
            }
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = (int)sVar17;
        }
LAB_005b0350:
        pVVar6->nSize = uVar13 + 1;
        pVVar6->pArray[(int)uVar13] = (char)iVar5;
        if (iVar5 == 0) {
          if (iVar4 == local_74) {
            lVar15 = (long)vPatts->nSize;
            if (lVar15 < 2) goto LAB_005b0631;
            iVar5 = (int)((ulong)((long)vPatts->pArray[1] - (long)*vPatts->pArray) >> 2);
            lVar16 = (long)(iVar5 * 2);
            ppvVar9 = (void **)malloc((lVar16 * 4 + 8) * lVar15);
            lVar10 = lVar15 * 8;
            lVar12 = 0;
            do {
              ppvVar9[lVar12] = (void *)(lVar10 + (long)ppvVar9);
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + lVar16 * 4;
            } while (lVar15 != lVar12);
            sVar17 = (size_t)(iVar5 << 2);
            lVar10 = 0;
            do {
              if (lVar15 == lVar10) goto LAB_005b0631;
              memcpy(ppvVar9[lVar10],vPatts->pArray[lVar10],sVar17);
              lVar10 = lVar10 + 1;
            } while (lVar10 < vPatts->nSize);
            if (vPatts->pArray != (void **)0x0) {
              free(vPatts->pArray);
              vPatts->pArray = (void **)0x0;
            }
            vPatts->pArray = ppvVar9;
            if (0 < vPatts->nSize) {
              lVar15 = 0;
              do {
                memset((void *)((long)vPatts->pArray[lVar15] + sVar17),0,sVar17);
                lVar15 = lVar15 + 1;
              } while (lVar15 < vPatts->nSize);
            }
            if (vPatts->nSize < 2) goto LAB_005b0631;
            local_74 = (*(int *)(vPatts->pArray + 1) - *(int *)vPatts->pArray & 0x1ffffffcU) << 3;
          }
          iVar5 = iVar4 + (uint)(iVar4 % iVar11 == 0);
          Gia_ManIncrementTravId(pAig);
          iVar4 = iVar5 + 1;
          Cec_ManSatSolveSeq_rec
                    (p,pAig,local_38 + -(ulong)((uint)*(undefined8 *)local_38 & 0x1fffffff),vPatts,
                     iVar5,nRegs);
        }
      }
      lVar14 = lVar14 + 1;
      pVVar8 = pAig->vCos;
    } while (lVar14 < pVVar8->nSize);
    iVar4 = iVar4 + -1;
    pPars = local_48;
    pnPats = local_40;
  }
  iVar11 = clock_gettime(3,&local_58);
  if (iVar11 < 0) {
    iVar11 = -1;
  }
  else {
    iVar11 = (int)(local_58.tv_nsec / 1000) + (int)local_58.tv_sec * 1000000;
  }
  p->timeTotal = iVar11 + local_60;
  Bar_ProgressStop(p_00);
  if (pPars->fVerbose != 0) {
    Cec_ManSatPrintStats(p);
  }
  Cec_ManSatStop(p);
  if (pnPats != (int *)0x0) {
    *pnPats = iVar4;
  }
  return pVVar6;
}

Assistant:

Vec_Str_t * Cec_ManSatSolveSeq( Vec_Ptr_t * vPatts, Gia_Man_t * pAig, Cec_ParSat_t * pPars, int nRegs, int * pnPats )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int iPat = 0, nPatsInit, nPats;
    int i, status;
    abctime clk = Abc_Clock();
    nPatsInit = nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    p = Cec_ManSatCreate( pAig, pPars );
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
//Abc_Print( 1, "output %d   status = %d\n", i, status );
        Vec_StrPush( vStatus, (char)status );
        if ( status != 0 )
            continue;
        // resize storage
        if ( iPat == nPats )
        {
            int nWords = Vec_PtrReadWordsSimInfo(vPatts);
            Vec_PtrReallocSimInfo( vPatts );
            Vec_PtrCleanSimInfo( vPatts, nWords, 2*nWords );
            nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
        }
        if ( iPat % nPatsInit == 0 )
            iPat++;
        // save the pattern
        Gia_ManIncrementTravId( pAig );
//        Vec_IntClear( p->vCex );
        Cec_ManSatSolveSeq_rec( p, pAig, Gia_ObjFanin0(pObj), vPatts, iPat++, nRegs );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
//        Cec_ManSatAddToStore( p->vCexStore, p->vCex );
//        if ( iPat == nPats )
//            break;
        // quit if one of them is solved
//        if ( pPars->fFirstStop )
//            break;
//        if ( iPat == 32 * 15 * 16 - 1 )
//            break;
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
    if ( pPars->fVerbose )
        Cec_ManSatPrintStats( p );
//    Abc_Print( 1, "Total number of cex literals = %d. (Ave = %d)\n", p->nCexLits, p->nCexLits/p->nSatSat );
    Cec_ManSatStop( p );
    if ( pnPats )
        *pnPats = iPat-1;
    return vStatus;
}